

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dunk.c
# Opt level: O3

int envy_bios_parse_hdtvtt(envy_bios *bios)

{
  byte bVar1;
  ushort uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  byte bVar6;
  long lVar7;
  envy_bios_hdtvtt_entry *peVar8;
  short sVar9;
  uint uVar10;
  undefined8 uVar11;
  uint uVar12;
  char *__format;
  ulong uVar13;
  int iVar15;
  undefined1 auVar14 [16];
  int iVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  int iVar34;
  int iVar35;
  int iVar38;
  undefined1 auVar36 [16];
  int iVar39;
  undefined1 auVar37 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar42 [16];
  
  uVar2 = (bios->hdtvtt).offset;
  iVar35 = 0;
  if (uVar2 != 0) {
    uVar10 = bios->length;
    if (uVar2 < uVar10) {
      (bios->hdtvtt).version = bios->data[(uint)uVar2];
      iVar15 = 0;
    }
    else {
      (bios->hdtvtt).version = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      uVar2 = (bios->hdtvtt).offset;
      uVar10 = bios->length;
      iVar15 = -0xe;
    }
    uVar13 = (ulong)uVar2;
    lVar7 = uVar13 + 1;
    if ((uint)lVar7 < uVar10) {
      (bios->hdtvtt).hlen = bios->data[lVar7];
      iVar39 = 0;
    }
    else {
      (bios->hdtvtt).hlen = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n",lVar7);
      uVar13 = (ulong)(bios->hdtvtt).offset;
      uVar10 = bios->length;
      iVar39 = -0xe;
    }
    uVar12 = (uint)uVar13;
    lVar7 = uVar13 + 2;
    if ((uint)lVar7 < uVar10) {
      (bios->hdtvtt).entriesnum = bios->data[lVar7];
      iVar16 = 0;
    }
    else {
      (bios->hdtvtt).entriesnum = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n",lVar7);
      uVar12 = (uint)(bios->hdtvtt).offset;
      uVar10 = bios->length;
      iVar16 = -0xe;
    }
    if ((uint)((ulong)uVar12 + 3) < uVar10) {
      (bios->hdtvtt).rlen = bios->data[(ulong)uVar12 + 3];
      iVar34 = 0;
    }
    else {
      (bios->hdtvtt).rlen = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar34 = -0xe;
    }
    iVar35 = -0xe;
    if (((iVar39 == 0 && iVar15 == 0) && iVar16 == 0) && iVar34 == 0) {
      envy_bios_block(bios,(uint)(bios->hdtvtt).offset,
                      (uint)(bios->hdtvtt).entriesnum * (uint)(bios->hdtvtt).rlen +
                      (uint)(bios->hdtvtt).hlen,"HDTVTT",-1);
      if (((bios->hdtvtt).version & 0xfe) == 0x10) {
        bVar1 = (bios->hdtvtt).hlen;
        uVar13 = (ulong)bVar1;
        uVar11 = 4;
        if (9 < bVar1) {
          uVar11 = 10;
        }
        uVar10 = (uint)uVar11;
        if (uVar10 < bVar1 || uVar10 == bVar1) {
          bVar6 = (bios->hdtvtt).rlen;
          if (1 < bVar6) {
            if (uVar10 < bVar1) {
              fprintf(_stderr,"HDTVTT table header longer than expected [%d > %d]\n");
              bVar6 = (bios->hdtvtt).rlen;
            }
            if (2 < bVar6) {
              envy_bios_parse_hdtvtt_cold_2();
            }
            bVar1 = (bios->hdtvtt).entriesnum;
            uVar13 = (ulong)bVar1;
            peVar8 = (envy_bios_hdtvtt_entry *)calloc(uVar13,2);
            (bios->hdtvtt).entries = peVar8;
            auVar5 = _DAT_00273c40;
            if (peVar8 != (envy_bios_hdtvtt_entry *)0x0) {
              if (uVar13 != 0) {
                bVar6 = (bios->hdtvtt).rlen;
                lVar7 = uVar13 - 1;
                auVar14._8_4_ = (int)lVar7;
                auVar14._0_8_ = lVar7;
                auVar14._12_4_ = (int)((ulong)lVar7 >> 0x20);
                sVar9 = (ushort)(bios->hdtvtt).hlen + (bios->hdtvtt).offset;
                uVar13 = 0;
                auVar14 = auVar14 ^ _DAT_00273c40;
                auVar17 = _DAT_00273c00;
                auVar18 = _DAT_00273c10;
                auVar19 = _DAT_00273c20;
                auVar20 = _DAT_00273c30;
                do {
                  auVar21 = auVar20 ^ auVar5;
                  iVar35 = auVar14._0_4_;
                  iVar34 = -(uint)(iVar35 < auVar21._0_4_);
                  iVar15 = auVar14._4_4_;
                  auVar22._4_4_ = -(uint)(iVar15 < auVar21._4_4_);
                  iVar39 = auVar14._8_4_;
                  iVar38 = -(uint)(iVar39 < auVar21._8_4_);
                  iVar16 = auVar14._12_4_;
                  auVar22._12_4_ = -(uint)(iVar16 < auVar21._12_4_);
                  auVar31._4_4_ = iVar34;
                  auVar31._0_4_ = iVar34;
                  auVar31._8_4_ = iVar38;
                  auVar31._12_4_ = iVar38;
                  auVar40 = pshuflw(in_XMM11,auVar31,0xe8);
                  auVar24._4_4_ = -(uint)(auVar21._4_4_ == iVar15);
                  auVar24._12_4_ = -(uint)(auVar21._12_4_ == iVar16);
                  auVar24._0_4_ = auVar24._4_4_;
                  auVar24._8_4_ = auVar24._12_4_;
                  auVar42 = pshuflw(in_XMM12,auVar24,0xe8);
                  auVar22._0_4_ = auVar22._4_4_;
                  auVar22._8_4_ = auVar22._12_4_;
                  auVar41 = pshuflw(auVar40,auVar22,0xe8);
                  auVar21._8_4_ = 0xffffffff;
                  auVar21._0_8_ = 0xffffffffffffffff;
                  auVar21._12_4_ = 0xffffffff;
                  auVar21 = (auVar41 | auVar42 & auVar40) ^ auVar21;
                  auVar21 = packssdw(auVar21,auVar21);
                  if ((auVar21 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(short *)((long)&peVar8->offset + uVar13) = sVar9;
                  }
                  auVar22 = auVar24 & auVar31 | auVar22;
                  auVar21 = packssdw(auVar22,auVar22);
                  auVar41._8_4_ = 0xffffffff;
                  auVar41._0_8_ = 0xffffffffffffffff;
                  auVar41._12_4_ = 0xffffffff;
                  auVar21 = packssdw(auVar21 ^ auVar41,auVar21 ^ auVar41);
                  if ((auVar21._0_4_ >> 0x10 & 1) != 0) {
                    *(ushort *)((long)&peVar8[1].offset + uVar13) = (ushort)bVar6 + sVar9;
                  }
                  auVar21 = auVar19 ^ auVar5;
                  iVar34 = -(uint)(iVar35 < auVar21._0_4_);
                  auVar36._4_4_ = -(uint)(iVar15 < auVar21._4_4_);
                  iVar38 = -(uint)(iVar39 < auVar21._8_4_);
                  auVar36._12_4_ = -(uint)(iVar16 < auVar21._12_4_);
                  auVar23._4_4_ = iVar34;
                  auVar23._0_4_ = iVar34;
                  auVar23._8_4_ = iVar38;
                  auVar23._12_4_ = iVar38;
                  auVar30._4_4_ = -(uint)(auVar21._4_4_ == iVar15);
                  auVar30._12_4_ = -(uint)(auVar21._12_4_ == iVar16);
                  auVar30._0_4_ = auVar30._4_4_;
                  auVar30._8_4_ = auVar30._12_4_;
                  auVar36._0_4_ = auVar36._4_4_;
                  auVar36._8_4_ = auVar36._12_4_;
                  auVar21 = auVar30 & auVar23 | auVar36;
                  auVar21 = packssdw(auVar21,auVar21);
                  auVar3._8_4_ = 0xffffffff;
                  auVar3._0_8_ = 0xffffffffffffffff;
                  auVar3._12_4_ = 0xffffffff;
                  auVar21 = packssdw(auVar21 ^ auVar3,auVar21 ^ auVar3);
                  if ((auVar21 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                    *(ushort *)((long)&peVar8[2].offset + uVar13) =
                         (ushort)bVar6 + (ushort)bVar6 + sVar9;
                  }
                  auVar24 = pshufhw(auVar23,auVar23,0x84);
                  auVar31 = pshufhw(auVar30,auVar30,0x84);
                  auVar22 = pshufhw(auVar24,auVar36,0x84);
                  auVar25._8_4_ = 0xffffffff;
                  auVar25._0_8_ = 0xffffffffffffffff;
                  auVar25._12_4_ = 0xffffffff;
                  auVar25 = (auVar22 | auVar31 & auVar24) ^ auVar25;
                  auVar24 = packssdw(auVar25,auVar25);
                  if ((auVar24 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                    *(ushort *)((long)&peVar8[3].offset + uVar13) =
                         (ushort)bVar6 + (ushort)bVar6 * 2 + sVar9;
                  }
                  auVar24 = auVar18 ^ auVar5;
                  iVar34 = -(uint)(iVar35 < auVar24._0_4_);
                  auVar27._4_4_ = -(uint)(iVar15 < auVar24._4_4_);
                  iVar38 = -(uint)(iVar39 < auVar24._8_4_);
                  auVar27._12_4_ = -(uint)(iVar16 < auVar24._12_4_);
                  auVar32._4_4_ = iVar34;
                  auVar32._0_4_ = iVar34;
                  auVar32._8_4_ = iVar38;
                  auVar32._12_4_ = iVar38;
                  auVar21 = pshuflw(auVar21,auVar32,0xe8);
                  auVar26._4_4_ = -(uint)(auVar24._4_4_ == iVar15);
                  auVar26._12_4_ = -(uint)(auVar24._12_4_ == iVar16);
                  auVar26._0_4_ = auVar26._4_4_;
                  auVar26._8_4_ = auVar26._12_4_;
                  in_XMM12 = pshuflw(auVar42 & auVar40,auVar26,0xe8);
                  in_XMM12 = in_XMM12 & auVar21;
                  auVar27._0_4_ = auVar27._4_4_;
                  auVar27._8_4_ = auVar27._12_4_;
                  auVar21 = pshuflw(auVar21,auVar27,0xe8);
                  auVar40._8_4_ = 0xffffffff;
                  auVar40._0_8_ = 0xffffffffffffffff;
                  auVar40._12_4_ = 0xffffffff;
                  auVar40 = (auVar21 | in_XMM12) ^ auVar40;
                  auVar21 = packssdw(auVar40,auVar40);
                  if ((auVar21 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(ushort *)((long)&peVar8[4].offset + uVar13) = (ushort)bVar6 * 4 + sVar9;
                  }
                  auVar27 = auVar26 & auVar32 | auVar27;
                  auVar21 = packssdw(auVar27,auVar27);
                  auVar42._8_4_ = 0xffffffff;
                  auVar42._0_8_ = 0xffffffffffffffff;
                  auVar42._12_4_ = 0xffffffff;
                  auVar21 = packssdw(auVar21 ^ auVar42,auVar21 ^ auVar42);
                  if ((auVar21 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                    *(ushort *)((long)&peVar8[5].offset + uVar13) =
                         (ushort)bVar6 + (ushort)bVar6 * 4 + sVar9;
                  }
                  auVar21 = auVar17 ^ auVar5;
                  iVar35 = -(uint)(iVar35 < auVar21._0_4_);
                  auVar37._4_4_ = -(uint)(iVar15 < auVar21._4_4_);
                  iVar39 = -(uint)(iVar39 < auVar21._8_4_);
                  auVar37._12_4_ = -(uint)(iVar16 < auVar21._12_4_);
                  auVar28._4_4_ = iVar35;
                  auVar28._0_4_ = iVar35;
                  auVar28._8_4_ = iVar39;
                  auVar28._12_4_ = iVar39;
                  auVar33._4_4_ = -(uint)(auVar21._4_4_ == iVar15);
                  auVar33._12_4_ = -(uint)(auVar21._12_4_ == iVar16);
                  auVar33._0_4_ = auVar33._4_4_;
                  auVar33._8_4_ = auVar33._12_4_;
                  auVar37._0_4_ = auVar37._4_4_;
                  auVar37._8_4_ = auVar37._12_4_;
                  auVar21 = auVar33 & auVar28 | auVar37;
                  auVar21 = packssdw(auVar21,auVar21);
                  auVar4._8_4_ = 0xffffffff;
                  auVar4._0_8_ = 0xffffffffffffffff;
                  auVar4._12_4_ = 0xffffffff;
                  in_XMM11 = packssdw(auVar21 ^ auVar4,auVar21 ^ auVar4);
                  if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                    *(ushort *)((long)&peVar8[6].offset + uVar13) =
                         ((ushort)bVar6 + (ushort)bVar6) * 3 + sVar9;
                  }
                  auVar21 = pshufhw(auVar28,auVar28,0x84);
                  auVar22 = pshufhw(auVar33,auVar33,0x84);
                  auVar24 = pshufhw(auVar21,auVar37,0x84);
                  auVar29._8_4_ = 0xffffffff;
                  auVar29._0_8_ = 0xffffffffffffffff;
                  auVar29._12_4_ = 0xffffffff;
                  auVar29 = (auVar24 | auVar22 & auVar21) ^ auVar29;
                  auVar21 = packssdw(auVar29,auVar29);
                  if ((auVar21 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                    *(ushort *)((long)&peVar8[7].offset + uVar13) =
                         ((ushort)bVar6 * 8 - (ushort)bVar6) + sVar9;
                  }
                  lVar7 = auVar20._8_8_;
                  auVar20._0_8_ = auVar20._0_8_ + 8;
                  auVar20._8_8_ = lVar7 + 8;
                  lVar7 = auVar19._8_8_;
                  auVar19._0_8_ = auVar19._0_8_ + 8;
                  auVar19._8_8_ = lVar7 + 8;
                  lVar7 = auVar18._8_8_;
                  auVar18._0_8_ = auVar18._0_8_ + 8;
                  auVar18._8_8_ = lVar7 + 8;
                  lVar7 = auVar17._8_8_;
                  auVar17._0_8_ = auVar17._0_8_ + 8;
                  auVar17._8_8_ = lVar7 + 8;
                  sVar9 = sVar9 + (ushort)bVar6 * 8;
                  uVar13 = uVar13 + 0x10;
                } while (((uint)bVar1 * 2 + 0xe & 0xfffffff0) != uVar13);
              }
              (bios->hdtvtt).valid = '\x01';
              return 0;
            }
            return -0xc;
          }
          __format = "HDTVTT table record too short [%d < %d]\n";
          uVar13 = (ulong)(uint)bVar6;
          uVar11 = 2;
        }
        else {
          __format = "HDTVTT table header too short [%d < %d]\n";
        }
        fprintf(_stderr,__format,uVar13,uVar11);
      }
      else {
        envy_bios_parse_hdtvtt_cold_1();
      }
      iVar35 = -0x16;
    }
  }
  return iVar35;
}

Assistant:

int envy_bios_parse_hdtvtt (struct envy_bios *bios) {
	struct envy_bios_hdtvtt *hdtvtt = &bios->hdtvtt;
	if (!hdtvtt->offset)
		return 0;
	int err = 0;
	err |= bios_u8(bios, hdtvtt->offset, &hdtvtt->version);
	err |= bios_u8(bios, hdtvtt->offset+1, &hdtvtt->hlen);
	err |= bios_u8(bios, hdtvtt->offset+2, &hdtvtt->entriesnum);
	err |= bios_u8(bios, hdtvtt->offset+3, &hdtvtt->rlen);
	if (err)
		return -EFAULT;
	envy_bios_block(bios, hdtvtt->offset, hdtvtt->hlen + hdtvtt->rlen * hdtvtt->entriesnum, "HDTVTT", -1);
	int wanthlen = 0;
	int wantrlen = 0;
	switch (hdtvtt->version) {
		case 0x10:
		case 0x11:
			wanthlen = 4;
			if (hdtvtt->hlen >= 10)
				wanthlen = 10;
			wantrlen = 2;
			break;
		default:
			ENVY_BIOS_ERR("Unknown HDTVTT table version %d.%d\n", hdtvtt->version >> 4, hdtvtt->version & 0xf);
			return -EINVAL;
	}
	if (hdtvtt->hlen < wanthlen) {
		ENVY_BIOS_ERR("HDTVTT table header too short [%d < %d]\n", hdtvtt->hlen, wanthlen);
		return -EINVAL;
	}
	if (hdtvtt->rlen < wantrlen) {
		ENVY_BIOS_ERR("HDTVTT table record too short [%d < %d]\n", hdtvtt->rlen, wantrlen);
		return -EINVAL;
	}
	if (hdtvtt->hlen > wanthlen) {
		ENVY_BIOS_WARN("HDTVTT table header longer than expected [%d > %d]\n", hdtvtt->hlen, wanthlen);
	}
	if (hdtvtt->rlen > wantrlen) {
		ENVY_BIOS_WARN("HDTVTT table record longer than expected [%d > %d]\n", hdtvtt->rlen, wantrlen);
	}
	hdtvtt->entries = calloc(hdtvtt->entriesnum, sizeof *hdtvtt->entries);
	if (!hdtvtt->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < hdtvtt->entriesnum; i++) {
		struct envy_bios_hdtvtt_entry *entry = &hdtvtt->entries[i];
		entry->offset = hdtvtt->offset + hdtvtt->hlen + hdtvtt->rlen * i;
	}
	hdtvtt->valid = 1;
	return 0;
}